

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessor.cpp
# Opt level: O0

bool __thiscall
solitaire::events::EventsProcessor::checkIfCollidesAndTryPullOutOrUncoverCardsFromAnyTableauPile
          (EventsProcessor *this,MouseLeftButtonDown *event)

{
  bool bVar1;
  uint *puVar2;
  PileId local_2c;
  uint local_28;
  PileId local_24;
  MouseLeftButtonDown *pMStack_20;
  PileId id;
  MouseLeftButtonDown *event_local;
  EventsProcessor *this_local;
  
  local_28 = 0;
  pMStack_20 = event;
  piles::PileId::PileId(&local_24,&local_28);
  while( true ) {
    puVar2 = piles::PileId::operator_cast_to_unsigned_int_(&local_24);
    if (6 < *puVar2) {
      return false;
    }
    piles::PileId::PileId(&local_2c,&local_24);
    bVar1 = checkIfCollidesAndTryPullOutOrUncoverCardsFromTableauPile(this,&local_2c,pMStack_20);
    if (bVar1) break;
    puVar2 = piles::PileId::operator_cast_to_unsigned_int_(&local_24);
    *puVar2 = *puVar2 + 1;
  }
  return true;
}

Assistant:

bool EventsProcessor::
checkIfCollidesAndTryPullOutOrUncoverCardsFromAnyTableauPile(
    const MouseLeftButtonDown& event) const
{
    for (PileId id {0}; id < Solitaire::tableauPilesCount; ++id)
        if (checkIfCollidesAndTryPullOutOrUncoverCardsFromTableauPile(id, event))
            return true;
    return false;
}